

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O0

void __thiscall
Saturation::PredicateSplitPassiveClauseContainer::PredicateSplitPassiveClauseContainer
          (PredicateSplitPassiveClauseContainer *this,bool isOutermost,Options *opt,string *name,
          vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
          *queues,vector<float,_std::allocator<float>_> *cutoffs,
          vector<int,_std::allocator<int>_> *ratios,bool layeredArrangement)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined8 uVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  string *in_RCX;
  Options *in_RDX;
  byte in_SIL;
  undefined8 *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  byte in_stack_00000010;
  uint i_2;
  uint i_1;
  int lcm;
  uint ri;
  uint i;
  string *in_stack_fffffffffffffce8;
  value_type_conflict *__x;
  int in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  int iVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  string *in_stack_fffffffffffffd08;
  Options *in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  undefined1 isOutermost_00;
  PassiveClauseContainer *in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffd38;
  char *__lhs;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffd40;
  uint local_248;
  uint local_244;
  int local_240;
  uint local_238;
  unsigned_long in_stack_fffffffffffffe28;
  string local_58 [39];
  byte local_31;
  Options *local_18;
  byte local_9;
  
  isOutermost_00 = (undefined1)((ulong)in_stack_fffffffffffffd18 >> 0x38);
  local_9 = in_SIL & 1;
  local_31 = in_stack_00000010 & 1;
  local_18 = in_RDX;
  std::__cxx11::string::string(local_58,in_RCX);
  PassiveClauseContainer::PassiveClauseContainer
            (in_stack_fffffffffffffd20,(bool)isOutermost_00,in_stack_fffffffffffffd10,
             in_stack_fffffffffffffd08);
  std::__cxx11::string::~string(local_58);
  *in_RDI = &PTR__PredicateSplitPassiveClauseContainer_01322008;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xac8be7);
  std::
  vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  ::vector((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
           (vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
            *)in_stack_fffffffffffffce8);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  __lhs = (char *)(in_RDI + 0x16);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xac8c44);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xac8c5d);
  *(byte *)(in_RDI + 0x1c) = local_31 & 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xac8c85);
  bVar1 = Shell::Options::randomAWR(local_18);
  *(bool *)(in_RDI + 0xb) = bVar1;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::vector<int,_std::allocator<int>_>::size(in_stack_00000008);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
           ::size((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                   *)(in_RDI + 0x10));
  if (__rhs != pbVar2) {
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x50);
    std::operator+(__lhs,__rhs);
    std::operator+(in_stack_fffffffffffffcf8,
                   (char *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
    std::vector<int,_std::allocator<int>_>::size(in_stack_00000008);
    Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffffe28);
    std::operator+(pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffd20);
    std::operator+(in_stack_fffffffffffffcf8,
                   (char *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
    std::
    vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
    ::size((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
            *)(in_RDI + 0x10));
    Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffffe28);
    std::operator+(pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffd20);
    Lib::UserErrorException::Exception
              ((UserErrorException *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
               in_stack_fffffffffffffce8);
    __cxa_throw(pbVar2,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::vector<float,_std::allocator<float>_>::size
                     ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x13));
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
           ::size((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                   *)(in_RDI + 0x10));
  if (pbVar2 == pbVar3) {
    if ((*(byte *)(in_RDI + 0xb) & 1) != 0) {
      *(undefined4 *)(in_RDI + 0xf) = 0;
      local_238 = 0;
      while( true ) {
        uVar5 = (ulong)local_238;
        sVar6 = std::vector<int,_std::allocator<int>_>::size(in_stack_00000008);
        if (sVar6 <= uVar5) break;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (in_stack_00000008,(ulong)local_238);
        *(int *)(in_RDI + 0xf) = *(int *)(in_RDI + 0xf) + *pvVar7;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                   (value_type_conflict *)in_stack_fffffffffffffcf8);
        local_238 = local_238 + 1;
      }
    }
    local_240 = 1;
    local_244 = 0;
    while( true ) {
      uVar5 = (ulong)local_244;
      sVar6 = std::vector<int,_std::allocator<int>_>::size(in_stack_00000008);
      if (sVar6 <= uVar5) break;
      std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000008,(ulong)local_244);
      local_240 = computeLCM(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0);
      local_244 = local_244 + 1;
    }
    local_248 = 0;
    while( true ) {
      uVar5 = (ulong)local_248;
      sVar6 = std::vector<int,_std::allocator<int>_>::size(in_stack_00000008);
      if (sVar6 <= uVar5) break;
      __x = (value_type_conflict *)(in_RDI + 0x16);
      iVar8 = local_240;
      std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000008,(ulong)local_248);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(iVar8,in_stack_fffffffffffffcf0),__x);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(iVar8,in_stack_fffffffffffffcf0),__x);
      local_248 = local_248 + 1;
    }
    return;
  }
  uVar4 = __cxa_allocate_exception(0x50);
  std::operator+(__lhs,__rhs);
  std::operator+(in_stack_fffffffffffffcf8,
                 (char *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
  std::vector<float,_std::allocator<float>_>::size
            ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x13));
  Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffffe28);
  std::operator+(in_stack_fffffffffffffd28,pbVar2);
  std::operator+(in_stack_fffffffffffffcf8,
                 (char *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
  std::
  vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  ::size((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
          *)(in_RDI + 0x10));
  Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffffe28);
  std::operator+(in_stack_fffffffffffffd28,pbVar2);
  Lib::UserErrorException::Exception
            ((UserErrorException *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
             in_stack_fffffffffffffce8);
  __cxa_throw(uVar4,&Lib::UserErrorException::typeinfo,Lib::UserErrorException::~UserErrorException)
  ;
}

Assistant:

PredicateSplitPassiveClauseContainer::PredicateSplitPassiveClauseContainer(bool isOutermost, const Shell::Options& opt, std::string name,
    std::vector<std::unique_ptr<PassiveClauseContainer>> queues,
    std::vector<float> cutoffs, std::vector<int> ratios, bool layeredArrangement)
  : PassiveClauseContainer(isOutermost, opt, name), _queues(std::move(queues)), _cutoffs(cutoffs), _layeredArrangement(layeredArrangement)
{
  _randomize = opt.randomAWR();

  // sanity checks
  if (ratios.size() != _queues.size()) {
    USER_ERROR("Queue " + name + ": The number of ratios needs to match the number of queues, but " + Int::toString(ratios.size()) + " != " + Int::toString(_queues.size()));
  }
  if (_cutoffs.size() != _queues.size()) {
    USER_ERROR("Queue " + name + ": The number of cutoffs needs to match the number of queues, but " + Int::toString(_cutoffs.size()) + " != " + Int::toString(_queues.size()));
  }

  if (_randomize) {
    _ratioSum = 0;
    for (unsigned i = 0; i < ratios.size(); i++) {
      unsigned ri = ratios[i];
      _ratioSum += ri;
      _ratios.push_back(ri);
    }
  }

  // even when randomizing true selection, we rely on the old ways for simulation:

  // compute lcm, which will be used to compute reverse ratios
  auto lcm = 1;
  for (unsigned i = 0; i < ratios.size(); i++)
  {
    lcm = computeLCM(lcm, ratios[i]);
  }
  // initialize
  for (unsigned i = 0; i < ratios.size(); i++)
  {
    _invertedRatios.push_back(lcm / ratios[i]);
    _balances.push_back(0);
  }
}